

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasum.c
# Opt level: O1

doublereal dasum_(integer *n,doublereal *dx,integer *incx)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  double *pdVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  
  uVar7 = *n;
  dVar19 = 0.0;
  if (0 < (int)uVar7) {
    iVar8 = *incx;
    if (0 < (long)iVar8) {
      if (iVar8 == 1) {
        uVar9 = uVar7 % 6;
        if (uVar9 != 0) {
          uVar12 = 0;
          do {
            dVar1 = dx[uVar12];
            uVar13 = -(ulong)(-dVar1 <= dVar1);
            dVar19 = dVar19 + (double)(~uVar13 & (ulong)-dVar1 | (ulong)dVar1 & uVar13);
            uVar12 = uVar12 + 1;
          } while (uVar7 % 6 != uVar12);
          if ((int)uVar7 < 6) {
            return dVar19;
          }
        }
        if ((int)uVar9 < (int)uVar7) {
          uVar12 = (ulong)(uVar9 + 1);
          pdVar10 = dx + uVar12;
          do {
            dVar1 = pdVar10[-1];
            dVar2 = *pdVar10;
            uVar13 = -(ulong)(-dVar1 <= dVar1);
            uVar14 = -(ulong)(-dVar2 <= dVar2);
            dVar3 = pdVar10[1];
            uVar15 = -(ulong)(-dVar3 <= dVar3);
            dVar4 = pdVar10[2];
            uVar16 = -(ulong)(-dVar4 <= dVar4);
            dVar5 = pdVar10[3];
            uVar17 = -(ulong)(-dVar5 <= dVar5);
            dVar6 = pdVar10[4];
            uVar18 = -(ulong)(-dVar6 <= dVar6);
            dVar19 = (double)(uVar18 & (ulong)dVar6 | ~uVar18 & (ulong)-dVar6) +
                     (double)(uVar17 & (ulong)dVar5 | ~uVar17 & (ulong)-dVar5) +
                     (double)(uVar16 & (ulong)dVar4 | ~uVar16 & (ulong)-dVar4) +
                     (double)(uVar15 & (ulong)dVar3 | ~uVar15 & (ulong)-dVar3) +
                     (double)(uVar14 & (ulong)dVar2 | ~uVar14 & (ulong)-dVar2) +
                     (double)(uVar13 & (ulong)dVar1 | ~uVar13 & (ulong)-dVar1) + dVar19;
            pdVar10 = pdVar10 + 6;
            uVar9 = (int)uVar12 + 6;
            uVar12 = (ulong)uVar9;
          } while ((int)uVar9 <= (int)uVar7);
        }
      }
      else if (0 < (int)(uVar7 * iVar8)) {
        iVar11 = 1;
        do {
          dVar1 = *dx;
          uVar12 = -(ulong)(-dVar1 <= dVar1);
          dVar19 = dVar19 + (double)(~uVar12 & (ulong)-dVar1 | (ulong)dVar1 & uVar12);
          dx = dx + iVar8;
          iVar11 = iVar11 + iVar8;
        } while (iVar11 <= (int)(uVar7 * iVar8));
      }
    }
  }
  return dVar19;
}

Assistant:

doublereal dasum_(integer *n, doublereal *dx, integer *incx)
{


    /* System generated locals */
 
    doublereal ret_val, d__1, d__2, d__3, d__4, d__5, d__6;

    /* Local variables */
    integer i, m;
    doublereal dtemp;
    integer nincx, mp1;


/*     takes the sum of the absolute values.   
       jack dongarra, linpack, 3/11/78.   
       modified 3/93 to return if incx .le. 0.   
       modified 12/3/93, array(1) declarations changed to array(*)   


    
   Parameter adjustments   
       Function Body */
#define DX(I) dx[(I)-1]


    ret_val = 0.;
    dtemp = 0.;
    if (*n <= 0 || *incx <= 0) {
	return ret_val;
    }
    if (*incx == 1) {
	goto L20;
    }

/*        code for increment not equal to 1 */

    nincx = *n * *incx;
    for (i = 1; *incx < 0 ? i >= nincx : i <= nincx; i += *incx) {
	dtemp += (d__1 = DX(i), abs(d__1));
/* L10: */
    }
    ret_val = dtemp;
    return ret_val;

/*        code for increment equal to 1   


          clean-up loop */

L20:
    m = *n % 6;
    if (m == 0) {
	goto L40;
    }
    for (i = 1; i <= m; ++i) {
	dtemp += (d__1 = DX(i), abs(d__1));
/* L30: */
    }
    if (*n < 6) {
	goto L60;
    }
L40:
    mp1 = m + 1;
    for (i = mp1; i <= *n; i += 6) {
	dtemp = dtemp + (d__1 = DX(i), abs(d__1)) + (d__2 = DX(i + 1), abs(
		d__2)) + (d__3 = DX(i + 2), abs(d__3)) + (d__4 = DX(i + 3), 
		abs(d__4)) + (d__5 = DX(i + 4), abs(d__5)) + (d__6 = DX(i + 5)
		, abs(d__6));
/* L50: */
    }
L60:
    ret_val = dtemp;
    return ret_val;
}